

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void __thiscall aim_t::SetResult(aim_t *this,AimTarget *res,double frac,AActor *th,DAngle *pitch)

{
  DVector3 local_68;
  TVector3<double> local_50;
  DAngle *local_30;
  DAngle *pitch_local;
  AActor *th_local;
  double frac_local;
  AimTarget *res_local;
  aim_t *this_local;
  
  if (frac < res->frac) {
    (res->super_FTranslatedLineTarget).linetarget = th;
    local_30 = pitch;
    pitch_local = (DAngle *)th;
    th_local = (AActor *)frac;
    frac_local = (double)res;
    res_local = (AimTarget *)this;
    TAngle<double>::operator=(&res->pitch,pitch);
    AActor::Pos(&local_68,(AActor *)pitch_local);
    TVector3<double>::operator-(&local_50,&local_68,&this->startpos);
    TVector3<double>::Angle((TVector3<double> *)&stack0xffffffffffffffc8);
    TAngle<double>::operator=
              ((TAngle<double> *)((long)frac_local + 8),(TAngle<double> *)&stack0xffffffffffffffc8);
    *(byte *)((long)frac_local + 0x10) = this->unlinked & 1;
    *(AActor **)((long)frac_local + 0x20) = th_local;
  }
  return;
}

Assistant:

void SetResult(AimTarget &res, double frac, AActor *th, DAngle pitch)
	{
		if (res.frac > frac)
		{
			res.linetarget = th;
			res.pitch = pitch;
			res.angleFromSource = (th->Pos() - startpos).Angle();
			res.unlinked = unlinked;
			res.frac = frac;
		}
	}